

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O0

DSFrame * __thiscall
DSFrame::Create(DSFrame *__return_storage_ptr__,DSFrame *this,bool copy,bool inplace)

{
  undefined1 auVar1 [16];
  VideoInfo avsvi;
  DSVideoInfo vi;
  ulong uVar2;
  uchar **ppuVar3;
  uint8_t *puVar4;
  void *pvVar5;
  undefined8 *puVar6;
  VSFrameRef *local_100;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  DSVideoInfo local_b0;
  int local_58;
  int i;
  undefined1 local_41;
  VSFrameRef *local_40;
  VSFrameRef *vsframe;
  int copy_planes [4];
  VSFrameRef *copy_frames [1];
  bool inplace_local;
  bool copy_local;
  DSFrame *this_local;
  DSFrame *new_frame;
  
  if (this->_vssrc == (VSFrameRef *)0x0) {
    pvVar5 = PVideoFrame::operator_cast_to_void_(&this->_avssrc);
    if (pvVar5 == (void *)0x0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "Unable to create from nothing.";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
    memcpy(&local_e0,&this->_vi,0x30);
    avsvi.fps_numerator = (undefined4)uStack_d8;
    avsvi.fps_denominator = uStack_d8._4_4_;
    avsvi.width = (undefined4)local_e0;
    avsvi.height = local_e0._4_4_;
    avsvi.num_frames = (undefined4)local_d0;
    avsvi.pixel_type = local_d0._4_4_;
    avsvi.audio_samples_per_second = (undefined4)uStack_c8;
    avsvi.sample_type = uStack_c8._4_4_;
    avsvi.num_audio_samples = local_c0;
    avsvi.nchannels = (undefined4)uStack_b8;
    avsvi.image_type = uStack_b8._4_4_;
    DSVideoInfo::DSVideoInfo(&local_b0,avsvi);
    vi.Format.SSW = local_b0.Format.SSW;
    vi.Format.SSH = local_b0.Format.SSH;
    vi.Format.IsFamilyYUV = local_b0.Format.IsFamilyYUV;
    vi.Format.IsFamilyRGB = local_b0.Format.IsFamilyRGB;
    vi.Format.IsFamilyYCC = local_b0.Format.IsFamilyYCC;
    vi.Format.IsInteger = local_b0.Format.IsInteger;
    vi.Format.IsFloat = local_b0.Format.IsFloat;
    vi.Format._5_3_ = local_b0.Format._5_3_;
    vi.Format.BitsPerSample = local_b0.Format.BitsPerSample;
    vi.Format.BytesPerSample = local_b0.Format.BytesPerSample;
    vi.Format.Planes = local_b0.Format.Planes;
    vi._28_4_ = local_b0._28_4_;
    vi.FPSNum = local_b0.FPSNum;
    vi.FPSDenom = local_b0.FPSDenom;
    vi.Width = local_b0.Width;
    vi.Height = local_b0.Height;
    vi.Frames = local_b0.Frames;
    vi.Audio_SPS = local_b0.Audio_SPS;
    vi.Audio_SType = local_b0.Audio_SType;
    vi._68_4_ = local_b0._68_4_;
    vi.Audio_NSamples = local_b0.Audio_NSamples;
    vi.Audio_NChannels = local_b0.Audio_NChannels;
    vi.Field = local_b0.Field;
    Create(__return_storage_ptr__,this,vi);
  }
  else {
    copy_planes._8_8_ = ToVSFrame(this);
    memset(&vsframe,0,0x10);
    if (copy) {
      local_100 = (*this->_vsapi->newVideoFrame2)
                            (this->_vsformat,this->FrameWidth,this->FrameHeight,
                             (VSFrameRef **)(copy_planes + 2),(int *)&vsframe,this->_vssrc,
                             this->_vscore);
    }
    else {
      local_100 = (*this->_vsapi->newVideoFrame)
                            (this->_vsformat,this->FrameWidth,this->FrameHeight,this->_vssrc,
                             this->_vscore);
    }
    local_40 = local_100;
    (*this->_vsapi->freeFrame)((VSFrameRef *)copy_planes._8_8_);
    local_41 = 0;
    DSFrame(__return_storage_ptr__,local_40,this->_vscore,this->_vsapi);
    __return_storage_ptr__->_vsdst = local_40;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->Format).Planes;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppuVar3 = (uchar **)operator_new__(uVar2);
    __return_storage_ptr__->DstPointers = ppuVar3;
    for (local_58 = 0; local_58 < (this->Format).Planes; local_58 = local_58 + 1) {
      puVar4 = (*this->_vsapi->getWritePtr)(local_40,local_58);
      __return_storage_ptr__->DstPointers[local_58] = puVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DSFrame Create(bool copy, bool inplace)
  {
    if (_vssrc) {
      // Create a new VS frame
      const VSFrameRef* copy_frames[1] {ToVSFrame()};
      int copy_planes[4] = {0};
      auto vsframe = copy ?
        _vsapi->newVideoFrame2(_vsformat, FrameWidth, FrameHeight, copy_frames, copy_planes, _vssrc, const_cast<VSCore*>(_vscore)) :
        _vsapi->newVideoFrame(_vsformat, FrameWidth, FrameHeight, _vssrc, const_cast<VSCore*>(_vscore));
      _vsapi->freeFrame(copy_frames[0]);

      DSFrame new_frame(vsframe, _vscore, _vsapi);
      new_frame._vsdst = vsframe;
      new_frame.DstPointers = new unsigned char*[Format.Planes];
      for (int i = 0; i < Format.Planes; i++)
        new_frame.DstPointers[i] = _vsapi->getWritePtr(vsframe, i);
      return new_frame;
    }
    else if(_avssrc) {
      // Create a new AVS frame
      return Create(_vi);
    }
    throw "Unable to create from nothing.";
  }